

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

size_t add_to_const_pool(gen_ctx *gen_ctx,uint64_t v)

{
  uint64_t *puVar1;
  size_t sVar2;
  size_t len;
  size_t n;
  uint64_t *addr;
  uint64_t v_local;
  gen_ctx *gen_ctx_local;
  
  puVar1 = VARR_uint64_taddr(gen_ctx->target_ctx->const_pool);
  sVar2 = VARR_uint64_tlength(gen_ctx->target_ctx->const_pool);
  len = 0;
  while( true ) {
    if (sVar2 <= len) {
      VARR_uint64_tpush(gen_ctx->target_ctx->const_pool,v);
      return sVar2;
    }
    if (puVar1[len] == v) break;
    len = len + 1;
  }
  return len;
}

Assistant:

static size_t add_to_const_pool (struct gen_ctx *gen_ctx, uint64_t v) {
  uint64_t *addr = VARR_ADDR (uint64_t, const_pool);
  size_t n, len = VARR_LENGTH (uint64_t, const_pool);

  for (n = 0; n < len; n++)
    if (addr[n] == v) return n;
  VARR_PUSH (uint64_t, const_pool, v);
  return len;
}